

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_vumeter.c
# Opt level: O3

void vu_draw_config(t_vu *x,_glist *glist)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  _glist *p_Var7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  char *pcVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  t_atom fontatoms [3];
  char tag [128];
  
  p_Var7 = (x->x_gui).x_glist;
  uVar1 = p_Var7->gl_zoom;
  p_Var7 = glist_getcanvas(p_Var7);
  iVar2 = text_xpix((t_text *)x,glist);
  uVar3 = text_ypix((t_text *)x,glist);
  uVar4 = x->x_led_size * uVar1;
  iVar6 = (x->x_gui).x_w;
  iVar15 = iVar6 + 3;
  if (-1 < iVar6) {
    iVar15 = iVar6;
  }
  uVar5 = iVar2 + (iVar15 >> 2);
  iVar10 = (x->x_led_size + 1) * uVar1;
  fontatoms[0].a_type = A_SYMBOL;
  fontatoms[0].a_w.w_symbol = gensym((x->x_gui).x_font);
  fontatoms[1].a_type = A_FLOAT;
  fontatoms[1].a_w._0_4_ = (undefined4)(int)-((x->x_gui).x_fontsize * uVar1);
  fontatoms[2].a_type = A_SYMBOL;
  fontatoms[2].a_w.w_symbol = gensym(sys_fontweight);
  sprintf(tag,"%lxBASE",x);
  pdgui_vmess((char *)0x0,"crs iiii",p_Var7,"coords",tag,(ulong)(iVar2 - uVar1),
              (ulong)(uVar3 + uVar1 * -2),(ulong)(iVar2 + uVar1 + (x->x_gui).x_w),
              (ulong)(uVar3 + uVar1 * 2 + (x->x_gui).x_h));
  pdgui_vmess((char *)0x0,"crs ri rk",p_Var7,"itemconfigure",tag,"-width",(ulong)uVar1,"-fill",
              (ulong)(uint)(x->x_gui).x_bcol);
  sprintf(tag,"%lxSCALE",x);
  uVar12 = 0xff;
  if (((x->x_gui).x_fsf.field_0x3 & 1) == 0) {
    uVar12 = (ulong)(uint)(x->x_gui).x_lcol;
  }
  uVar8 = (ulong)(uint)(iVar6 / 2 + iVar2);
  uVar9 = (iVar6 + iVar2) - (iVar15 >> 2);
  iVar6 = iVar6 + iVar2 + uVar1 * 4;
  pdgui_vmess((char *)0x0,"crs rA rk",p_Var7,"itemconfigure",tag,"-font",3,fontatoms,"-fill",uVar12)
  ;
  sprintf(tag,"%lxRLED",x);
  pdgui_vmess((char *)0x0,"crs ri",p_Var7,"itemconfigure",tag,"-width",(ulong)uVar4);
  uVar14 = uVar3 + iVar10 * 0x28;
  lVar11 = 0;
  do {
    uVar16 = (int)lVar11 + 1;
    sprintf(tag,"%lxRLED%d",x,(ulong)uVar16);
    iVar15 = iemgui_vu_col[lVar11 + 1];
    uVar12 = (ulong)(uVar14 - iVar10 / 2);
    pdgui_vmess((char *)0x0,"crs iiii",p_Var7,"coords",tag,(ulong)(uVar5 + uVar1),uVar12,
                (ulong)uVar9,uVar12);
    pdgui_vmess((char *)0x0,"crs rk",p_Var7,"itemconfigure",tag,"-fill",
                (ulong)(uint)iemgui_color_hex[iVar15]);
    sprintf(tag,"%lxSCALE%d",x,(ulong)uVar16);
    pdgui_vmess((char *)0x0,"crs ii",p_Var7,"coords",tag,iVar6,(ulong)uVar14);
    if ((uVar16 & 3) != 2) {
      pcVar13 = "";
      if (x->x_scale != 0) {
        pcVar13 = iemgui_vu_scale_str[lVar11 + 1];
      }
      pdgui_vmess((char *)0x0,"crs rs",p_Var7,"itemconfigure",tag,"-text",pcVar13);
    }
    uVar14 = uVar14 - iVar10;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 0x29);
  sprintf(tag,"%lxSCALE%d",x,0x29);
  pdgui_vmess((char *)0x0,"crs ii",p_Var7,"coords",tag,iVar6,(ulong)uVar3);
  pcVar13 = iemgui_vu_scale_str[0x29];
  if (x->x_scale == 0) {
    pcVar13 = "";
  }
  pdgui_vmess((char *)0x0,"crs rs",p_Var7,"itemconfigure",tag,"-text",pcVar13);
  sprintf(tag,"%lxRCOVER",x);
  pdgui_vmess((char *)0x0,"crs iiii",p_Var7,"coords",tag,(ulong)uVar5,(ulong)(uVar3 - uVar1),
              (ulong)(uVar9 + uVar1),(ulong)((uVar3 - uVar1) + iVar10 * 0x28));
  uVar12 = (ulong)(uint)(x->x_gui).x_bcol;
  pdgui_vmess((char *)0x0,"crs rk rk",p_Var7,"itemconfigure",tag,"-fill",uVar12,"-outline",uVar12);
  sprintf(tag,"%lxPLED",x);
  uVar12 = (ulong)(uVar3 + uVar1 * 10);
  pdgui_vmess((char *)0x0,"crs iiii",p_Var7,"coords",tag,uVar8,uVar12,uVar8,uVar12);
  pdgui_vmess((char *)0x0,"crs ri rk",p_Var7,"itemconfigure",tag,"-width",(ulong)(uVar4 + uVar1),
              "-fill",(ulong)(uint)(x->x_gui).x_bcol);
  sprintf(tag,"%lxLABEL",x);
  pdgui_vmess((char *)0x0,"crs ii",p_Var7,"coords",tag,(ulong)((x->x_gui).x_ldx * uVar1 + iVar2),
              (ulong)(uVar1 * (x->x_gui).x_ldy + uVar3));
  uVar12 = 0xff;
  if (((x->x_gui).x_fsf.field_0x3 & 1) == 0) {
    uVar12 = (ulong)(uint)(x->x_gui).x_lcol;
  }
  pdgui_vmess((char *)0x0,"crs rA rk",p_Var7,"itemconfigure",tag,"-font",3,fontatoms,"-fill",uVar12)
  ;
  iemgui_dolabel(x,&x->x_gui,(x->x_gui).x_lab,1);
  x->field_0x4b8 = x->field_0x4b8 | 3;
  return;
}

Assistant:

static void vu_draw_config(t_vu* x, t_glist* glist)
{
    const int zoom = IEMGUI_ZOOM(x);
    t_iemgui *iemgui = &x->x_gui;
    t_canvas *canvas = glist_getcanvas(glist);
    int xpos = text_xpix(&x->x_gui.x_obj, glist);
    int ypos = text_ypix(&x->x_gui.x_obj, glist);
    int hmargin = HMARGIN * zoom, vmargin = VMARGIN * zoom;
    int iow = IOWIDTH * zoom, ioh = IEM_GUI_IOHEIGHT * zoom;
    int ledw = x->x_led_size * zoom;
    int fs = x->x_gui.x_fontsize * zoom;
    int w4 = x->x_gui.x_w/4, mid = xpos + x->x_gui.x_w/2,
        quad1 = xpos + w4 + zoom;
    int quad3 = xpos + x->x_gui.x_w - w4,
        end = xpos + x->x_gui.x_w + 4*zoom;
    int k1 = (x->x_led_size+1)*zoom, k2 = IEM_VU_STEPS+1, k3 = k1/2;
    int led_col, yyy, k4 = ypos - k3;
    int i;
    char tag[128];
    t_atom fontatoms[3];
    SETSYMBOL(fontatoms+0, gensym(iemgui->x_font));
    SETFLOAT (fontatoms+1, -iemgui->x_fontsize*zoom);
    SETSYMBOL(fontatoms+2, gensym(sys_fontweight));

    sprintf(tag, "%lxBASE", x);
    pdgui_vmess(0, "crs iiii", canvas, "coords", tag,
        xpos - hmargin, ypos - vmargin,
        xpos+x->x_gui.x_w + hmargin, ypos+x->x_gui.x_h + vmargin);
    pdgui_vmess(0, "crs ri rk", canvas, "itemconfigure", tag,
        "-width", zoom,
        "-fill", x->x_gui.x_bcol);

    sprintf(tag, "%lxSCALE", x);
    pdgui_vmess(0, "crs rA rk", canvas, "itemconfigure", tag,
        "-font", 3, fontatoms,
        "-fill", x->x_gui.x_fsf.x_selected ? IEM_GUI_COLOR_SELECTED : x->x_gui.x_lcol);
    sprintf(tag, "%lxRLED", x);
    pdgui_vmess(0, "crs ri", canvas, "itemconfigure", tag, "-width", ledw);

    for(i = 1; i <= IEM_VU_STEPS + 1; i++)
    {
        sprintf(tag, "%lxRLED%d", x, i);
        led_col = iemgui_vu_col[i];
        yyy = k4 + k1*(k2-i);
        pdgui_vmess(0, "crs iiii", canvas, "coords", tag,
            quad1, yyy, quad3, yyy);
        pdgui_vmess(0, "crs rk", canvas, "itemconfigure", tag,
            "-fill", iemgui_color_hex[led_col]);

        sprintf(tag, "%lxSCALE%d", x, i);
        pdgui_vmess(0, "crs ii", canvas, "coords", tag,
            end, yyy + k3);
        if((i+2) & 3)
            pdgui_vmess(0, "crs rs", canvas, "itemconfigure", tag,
            "-text", (x->x_scale)?iemgui_vu_scale_str[i]:"");
    }

    i = IEM_VU_STEPS + 1;
    yyy = k4 + k1 * (k2 - i);

        /* this was already set in the loop above, overwritten here */
    sprintf(tag, "%lxSCALE%d", x, i);
    pdgui_vmess(0, "crs ii", canvas, "coords", tag,
        end, yyy + k3);

    pdgui_vmess(0, "crs rs", canvas, "itemconfigure", tag,
        "-text", (x->x_scale)?iemgui_vu_scale_str[i]:"");

    sprintf(tag, "%lxRCOVER", x);
    pdgui_vmess(0, "crs iiii", canvas, "coords", tag,
        quad1 - zoom, ypos - zoom,
        quad3 + zoom, ypos - zoom + k1*IEM_VU_STEPS);
    pdgui_vmess(0, "crs rk rk", canvas, "itemconfigure", tag,
        "-fill", x->x_gui.x_bcol, "-outline", x->x_gui.x_bcol);

    sprintf(tag, "%lxPLED", x);
    pdgui_vmess(0, "crs iiii", canvas, "coords", tag,
        mid, ypos + PEAKHEIGHT * zoom,
        mid, ypos + PEAKHEIGHT * zoom);
    pdgui_vmess(0, "crs ri rk", canvas, "itemconfigure", tag,
        "-width", ledw+zoom, /* peak LED is slightly fatter */
        "-fill", x->x_gui.x_bcol);

    sprintf(tag, "%lxLABEL", x);
    pdgui_vmess(0, "crs ii", canvas, "coords", tag,
        xpos+x->x_gui.x_ldx * zoom, ypos+x->x_gui.x_ldy * zoom);
    pdgui_vmess(0, "crs rA rk", canvas, "itemconfigure", tag,
        "-font", 3, fontatoms,
        "-fill", x->x_gui.x_fsf.x_selected ? IEM_GUI_COLOR_SELECTED : x->x_gui.x_lcol);
    iemgui_dolabel(x, &x->x_gui, x->x_gui.x_lab, 1);

    x->x_updaterms = x->x_updatepeak = 1;
}